

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::stack_type<cs::domain_type,_std::allocator>::push<>
          (stack_type<cs::domain_type,_std::allocator> *this)

{
  domain_type *this_00;
  long lVar1;
  error *this_01;
  allocator local_31;
  string local_30;
  
  this_00 = this->m_current;
  lVar1 = (long)this_00 - (long)this->m_start;
  if (lVar1 / 0x60 != this->m_size) {
    this->m_current = this_00 + 1;
    domain_type::domain_type(this_00);
    return;
  }
  this_01 = (error *)__cxa_allocate_exception(0x28,0x60,lVar1 % 0x60);
  std::__cxx11::string::string((string *)&local_30,"E000I",&local_31);
  cov::error::error(this_01,&local_30);
  __cxa_throw(this_01,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void push(ArgsT &&...args)
		{
			if (full())
				throw cov::error("E000I");
			::new(m_current++) T(std::forward<ArgsT>(args)...);
		}